

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O1

void Ins_UNKNOWN(TT_ExecContext exc)

{
  TT_DefArray pTVar1;
  int iVar2;
  TT_CallStack pTVar3;
  FT_Byte *pFVar4;
  long lVar5;
  long lVar6;
  TT_DefArray pTVar7;
  
  if ((ulong)exc->numIDefs != 0) {
    pTVar7 = exc->IDefs;
    pTVar1 = pTVar7 + exc->numIDefs;
    do {
      if ((exc->opcode == (FT_Byte)pTVar7->opc) && (pTVar7->active != '\0')) {
        iVar2 = exc->callTop;
        if (iVar2 < exc->callSize) {
          pTVar3 = exc->callStack;
          exc->callTop = iVar2 + 1;
          pTVar3[iVar2].Caller_Range = exc->curRange;
          pTVar3[iVar2].Caller_IP = exc->IP + 1;
          pTVar3[iVar2].Cur_Count = 1;
          pTVar3[iVar2].Def = pTVar7;
          iVar2 = pTVar7->range;
          if (iVar2 - 4U < 0xfffffffd) {
            exc->error = 0x84;
          }
          else {
            pFVar4 = exc->codeRangeTable[iVar2 - 1U].base;
            if (pFVar4 == (FT_Byte *)0x0) {
              exc->error = 0x8a;
            }
            else {
              lVar5 = pTVar7->start;
              lVar6 = exc->codeRangeTable[iVar2 - 1U].size;
              if (lVar6 < lVar5) {
                exc->error = 0x83;
              }
              else {
                exc->code = pFVar4;
                exc->codeSize = lVar6;
                exc->IP = lVar5;
                exc->curRange = iVar2;
              }
            }
          }
          exc->step_ins = '\0';
          return;
        }
        exc->error = 0x82;
        return;
      }
      pTVar7 = pTVar7 + 1;
    } while (pTVar7 < pTVar1);
  }
  exc->error = 0x80;
  return;
}

Assistant:

static void
  Ins_UNKNOWN( TT_ExecContext  exc )
  {
    TT_DefRecord*  def   = exc->IDefs;
    TT_DefRecord*  limit = def + exc->numIDefs;


    for ( ; def < limit; def++ )
    {
      if ( (FT_Byte)def->opc == exc->opcode && def->active )
      {
        TT_CallRec*  call;


        if ( exc->callTop >= exc->callSize )
        {
          exc->error = FT_THROW( Stack_Overflow );
          return;
        }

        call = exc->callStack + exc->callTop++;

        call->Caller_Range = exc->curRange;
        call->Caller_IP    = exc->IP + 1;
        call->Cur_Count    = 1;
        call->Def          = def;

        Ins_Goto_CodeRange( exc, def->range, def->start );

        exc->step_ins = FALSE;
        return;
      }
    }

    exc->error = FT_THROW( Invalid_Opcode );
  }